

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

void __thiscall cppcms::http::response::response(response *this,context *context)

{
  _data *this_00;
  cached_settings *pcVar1;
  element_type *in_RSI;
  connection *in_RDI;
  string *in_stack_fffffffffffffea8;
  response *in_stack_fffffffffffffeb0;
  response *this_01;
  connection *c;
  undefined1 local_e1 [40];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string *in_stack_ffffffffffffff98;
  response *in_stack_ffffffffffffffa0;
  allocator local_41;
  string local_40 [48];
  element_type *local_10;
  
  c = in_RDI;
  local_10 = in_RSI;
  booster::noncopyable::noncopyable((noncopyable *)in_RDI);
  this_00 = (_data *)operator_new(0x530);
  http::context::connection((context *)0x3991af);
  _data::_data(this_00,c);
  booster::hold_ptr<cppcms::http::response::_data>::hold_ptr
            ((hold_ptr<cppcms::http::response::_data> *)in_RDI,this_00);
  (c->super_enable_shared_from_this<cppcms::impl::cgi::connection>)._M_weak_this.
  super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_10;
  (c->super_enable_shared_from_this<cppcms::impl::cgi::connection>)._M_weak_this.
  super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)&(c->pool_).page_size_ = 3;
  *(byte *)((long)&(c->pool_).page_size_ + 4) = *(byte *)((long)&(c->pool_).page_size_ + 4) & 0xfe;
  *(byte *)((long)&(c->pool_).page_size_ + 4) = *(byte *)((long)&(c->pool_).page_size_ + 4) & 0xfd;
  *(byte *)((long)&(c->pool_).page_size_ + 4) = *(byte *)((long)&(c->pool_).page_size_ + 4) & 0xfb;
  *(byte *)((long)&(c->pool_).page_size_ + 4) = *(byte *)((long)&(c->pool_).page_size_ + 4) & 0xf7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"text/html",&local_41);
  set_content_header(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  http::context::service((context *)0x399285);
  pcVar1 = service::cached_settings((service *)0x399296);
  if (((pcVar1->service).disable_xpowered_by & 1U) == 0) {
    http::context::service((context *)0x3992c1);
    pcVar1 = service::cached_settings((service *)0x3992d2);
    if (((pcVar1->service).disable_xpowered_by_version & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"X-Powered-By",&local_b9);
      this_01 = (response *)local_e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_e1 + 1),"CppCMS/2.0.0.beta2",(allocator *)this_01);
      set_header(this_01,in_stack_fffffffffffffea8,(string *)0x399519);
      std::__cxx11::string::~string((string *)(local_e1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_e1);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff98,"X-Powered-By",&local_69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"CppCMS",&local_91);
      set_header(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(string *)0x39935c);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
  }
  return;
}

Assistant:

response::response(context &context) :
	d(new _data(&context.connection())),
	context_(context),
	stream_(0),
	io_mode_(asynchronous),
	disable_compression_(0),
	ostream_requested_(0),
	copy_to_cache_(0),
	finalized_(0)
{
	set_content_header("text/html");
	if(context_.service().cached_settings().service.disable_xpowered_by==false) {
		if(context_.service().cached_settings().service.disable_xpowered_by_version)
			set_header("X-Powered-By", CPPCMS_PACKAGE_NAME);
		else
			set_header("X-Powered-By", CPPCMS_PACKAGE_NAME "/" CPPCMS_PACKAGE_VERSION);
	}
}